

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O3

void anon_unknown.dwarf_8e5514::CheckInferDescriptor
               (string *script_hex,string *expected_desc,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *hex_scripts,
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *origin_pubkeys)

{
  pointer *ppuVar1;
  char cVar2;
  pointer ppVar3;
  undefined8 *puVar4;
  long lVar5;
  pointer pbVar6;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  bool bVar7;
  int iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long lVar11;
  ulong uVar12;
  pointer ppVar13;
  long *in_R8;
  long *plVar14;
  iterator in_R9;
  undefined8 *puVar15;
  uint uVar16;
  long lVar17;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  string_view hex_str_02;
  const_string file;
  const_string msg;
  string_view separators;
  string_view str;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  undefined1 local_2f8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_bytes;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *local_2d0;
  char *local_2c8;
  char *local_2c0;
  Span<const_char> origin_sp;
  shared_count sStack_2a8;
  uint32_t p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fpr_bytes;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> origin_split;
  undefined1 local_240 [24];
  undefined8 local_228;
  uchar local_1f8 [4];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f0;
  string fpr_str;
  string checksum;
  vector<unsigned_char,_std::allocator<unsigned_char>_> prov_script_bytes;
  FlatSigningProvider provider;
  direct_or_indirect local_58;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (char *)script_hex;
  hex_str._M_len = (size_t)expected_desc;
  plVar14 = in_R8;
  ParseHex<unsigned_char>(&script_bytes,hex_str);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_01399da8;
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppVar13 = (origin_pubkeys->
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (origin_pubkeys->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppVar13 != ppVar3) {
    do {
      hex_str_00._M_str = (ppVar13->first)._M_dataplus._M_p;
      hex_str_00._M_len = (ppVar13->first)._M_string_length;
      ParseHex<unsigned_char>(&prov_script_bytes,hex_str_00);
      last._M_current._1_7_ =
           prov_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish._1_7_;
      last._M_current._0_1_ =
           prov_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish._0_1_;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::
      prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_240,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )prov_script_bytes.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,last);
      CScriptID::CScriptID((CScriptID *)&checksum,(CScript *)local_240);
      std::
      _Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
      ::_M_emplace_unique<CScriptID,CScript_const&>
                ((_Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                  *)&provider.scripts,(CScriptID *)&checksum,(CScript *)local_240);
      if (0x1c < local_228._4_4_) {
        free((void *)local_240._0_8_);
      }
      if (prov_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(prov_script_bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)prov_script_bytes.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)prov_script_bytes.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      ppVar13 = (pointer)&ppVar13->second;
    } while (ppVar13 != ppVar3);
  }
  puVar15 = (undefined8 *)*in_R8;
  puVar4 = (undefined8 *)in_R8[1];
  if (puVar15 != puVar4) {
    do {
      hex_str_01._M_str = (char *)*puVar15;
      hex_str_01._M_len = puVar15[1];
      ParseHex<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240,hex_str_01);
      CPubKey::Set<unsigned_char_const*>
                ((CPubKey *)&prov_script_bytes,(uchar *)local_240._0_8_,
                 (uchar *)CONCAT71(local_240._9_7_,local_240[8]));
      if ((uchar *)local_240._0_8_ != (uchar *)0x0) {
        operator_delete((void *)local_240._0_8_,local_240._16_8_ - local_240._0_8_);
      }
      CPubKey::GetID((CKeyID *)local_240,(CPubKey *)&prov_script_bytes);
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
      ::_M_emplace_unique<CKeyID,CPubKey&>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                  *)&provider.pubkeys,(CKeyID *)local_240,(CPubKey *)&prov_script_bytes);
      if (puVar15[5] != 0) {
        checksum._M_string_length = 0;
        checksum.field_2._M_allocated_capacity = 0;
        checksum.field_2._8_8_ = 0;
        origin_sp.m_data = (char *)puVar15[4];
        separators._M_str = (char *)plVar14;
        separators._M_len = (size_t)"/";
        origin_sp.m_size = puVar15[5];
        util::Split<Span<char_const>>
                  (&origin_split,(util *)&origin_sp,(Span<const_char> *)0x1,separators);
        fpr_str._M_dataplus._M_p = (pointer)&fpr_str.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&fpr_str,
                   (origin_split.
                    super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl
                    .super__Vector_impl_data._M_start)->m_data,
                   (origin_split.
                    super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl
                    .super__Vector_impl_data._M_start)->m_data +
                   (origin_split.
                    super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl
                    .super__Vector_impl_data._M_start)->m_size);
        hex_str_02._M_len._1_7_ = fpr_str._M_string_length._1_7_;
        hex_str_02._M_len._0_1_ = (undefined1)fpr_str._M_string_length;
        hex_str_02._M_str = fpr_str._M_dataplus._M_p;
        ParseHex<unsigned_char>(&fpr_bytes,hex_str_02);
        if ((long)fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0) {
          memmove(&checksum,
                  fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
                  (long)fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        }
        if (0x10 < (ulong)((long)origin_split.
                                 super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)origin_split.
                                super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          uVar12 = 1;
          lVar17 = 0x18;
          do {
            lVar5 = *(long *)((long)origin_split.
                                    super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar17 + -8);
            lVar11 = *(long *)((long)&(origin_split.
                                       super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar17);
            uVar16 = 0;
            if (lVar11 == 0) {
              lVar11 = 0;
            }
            else {
              cVar2 = *(char *)(lVar5 + -1 + lVar11);
              if ((cVar2 == 'h') || (uVar16 = 0, cVar2 == '\'')) {
                lVar11 = lVar11 + -1;
                uVar16 = 0x80000000;
              }
            }
            local_240._0_8_ = local_240 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_240,lVar5,lVar11 + lVar5);
            str._M_len._1_7_ = local_240._9_7_;
            str._M_len._0_1_ = local_240[8];
            str._M_str = (char *)local_240._0_8_;
            bVar7 = ParseUInt32(str,&p);
            if (!bVar7) {
              __assert_fail("ParseUInt32(std::string(elem.begin(), elem.end()), &p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                            ,0x1d3,
                            "void (anonymous namespace)::CheckInferDescriptor(const std::string &, const std::string &, const std::vector<std::string> &, const std::vector<std::pair<std::string, std::string>> &)"
                           );
            }
            if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
              operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
            }
            local_240._0_4_ = uVar16 | p;
            if (checksum.field_2._M_allocated_capacity == checksum.field_2._8_8_) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &checksum._M_string_length,(iterator)checksum.field_2._M_allocated_capacity
                         ,(uint *)local_240);
            }
            else {
              *(uint *)checksum.field_2._M_allocated_capacity = uVar16 | p;
              checksum.field_2._M_allocated_capacity = checksum.field_2._M_allocated_capacity + 4;
            }
            uVar12 = uVar12 + 1;
            lVar17 = lVar17 + 0x10;
          } while (uVar12 < (ulong)((long)origin_split.
                                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)origin_split.
                                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
        CPubKey::GetID((CKeyID *)&p,(CPubKey *)&prov_script_bytes);
        memcpy((pair<CPubKey,_KeyOriginInfo> *)local_240,(CPubKey *)&prov_script_bytes,0x41);
        local_1f8[0] = (uchar)checksum._M_dataplus._M_p;
        local_1f8[1] = checksum._M_dataplus._M_p._1_1_;
        local_1f8[2] = checksum._M_dataplus._M_p._2_1_;
        local_1f8[3] = checksum._M_dataplus._M_p._3_1_;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_1f0,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&checksum._M_string_length
                  );
        std::
        _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
        ::_M_emplace_unique<CKeyID,std::pair<CPubKey,KeyOriginInfo>>
                  ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
                    *)&provider.origins,(CKeyID *)&p,(pair<CPubKey,_KeyOriginInfo> *)local_240);
        if (local_1f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(fpr_bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)fpr_bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)fpr_bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fpr_str._M_dataplus._M_p != &fpr_str.field_2) {
          operator_delete(fpr_str._M_dataplus._M_p,fpr_str.field_2._M_allocated_capacity + 1);
        }
        if (origin_split.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(origin_split.
                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)origin_split.
                                super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)origin_split.
                                super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (checksum._M_string_length != 0) {
          operator_delete((void *)checksum._M_string_length,
                          checksum.field_2._8_8_ - checksum._M_string_length);
        }
      }
      puVar15 = puVar15 + 8;
    } while (puVar15 != puVar4);
  }
  GetDescriptorChecksum(&checksum,(string *)hex_scripts);
  InferDescriptor((CScript *)local_2f8,(SigningProvider *)&local_58.indirect_contents);
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1de;
  file.m_begin = (iterator)&local_308;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)plVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_318,msg);
  fpr_str._M_string_length._0_1_ = 0;
  fpr_str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
  fpr_str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  fpr_str.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  (**(code **)(*(long *)local_2f8 + 0x20))(&origin_split,local_2f8,0);
  pbVar6 = (hex_scripts->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  _p = (pointer)&local_290;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&p,pbVar6,
             (long)&(((hex_scripts->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p + (long)pbVar6
            );
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,"#");
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                     (char *)CONCAT44(checksum._M_dataplus._M_p._4_4_,
                                      checksum._M_dataplus._M_p._0_4_),checksum._M_string_length);
  ppuVar1 = &fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(pbVar9->_M_dataplus)._M_p;
  paVar10 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start == paVar10) {
    fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)paVar10->_M_allocated_capacity;
    fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar1;
  }
  else {
    fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)paVar10->_M_allocated_capacity;
  }
  fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  if (origin_split.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (pointer)fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish) {
    if (origin_split.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      bVar7 = true;
    }
    else {
      iVar8 = bcmp(origin_split.
                   super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (size_t)origin_split.
                           super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
      bVar7 = iVar8 == 0;
    }
  }
  else {
    bVar7 = false;
  }
  origin_sp.m_data = (char *)CONCAT71(origin_sp.m_data._1_7_,bVar7);
  origin_sp.m_size = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_2c0 = "";
  local_228 = &local_2d0;
  local_240[8] = '\0';
  local_240._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_240._16_8_ = boost::unit_test::lazy_ostream::inst;
  prov_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  prov_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388fc8;
  prov_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_2d0 = &origin_split;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&origin_sp,(lazy_ostream *)&fpr_str,1,2,REQUIRE,0xe73243,
             (size_t)&local_2c8,0x1de,local_240,"expected_desc + \"#\" + checksum",
             &prov_script_bytes);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  if ((pointer *)
      fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)(fpr_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_p != &local_290) {
    operator_delete(_p,local_290._M_allocated_capacity + 1);
  }
  if (origin_split.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&origin_split.
                super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    operator_delete(origin_split.
                    super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (ulong)((long)&(origin_split.
                                    super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1)
                   );
  }
  if (local_2f8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_2f8 + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(checksum._M_dataplus._M_p._4_4_,checksum._M_dataplus._M_p._0_4_) !=
      &checksum.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(checksum._M_dataplus._M_p._4_4_,checksum._M_dataplus._M_p._0_4_),
                    checksum.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  ::~_Rb_tree(&provider.tr_trees._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&provider.keys._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::~_Rb_tree(&provider.origins._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  ::~_Rb_tree(&provider.pubkeys._M_t);
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&provider.scripts._M_t);
  if (0x1c < local_3c) {
    free(local_58.indirect_contents.indirect);
  }
  if (script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)script_bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)script_bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CheckInferDescriptor(const std::string& script_hex, const std::string& expected_desc, const std::vector<std::string>& hex_scripts, const std::vector<std::pair<std::string, std::string>>& origin_pubkeys)
{
    std::vector<unsigned char> script_bytes{ParseHex(script_hex)};
    const CScript& script{script_bytes.begin(), script_bytes.end()};

    FlatSigningProvider provider;
    for (const std::string& prov_script_hex : hex_scripts) {
        std::vector<unsigned char> prov_script_bytes{ParseHex(prov_script_hex)};
        const CScript& prov_script{prov_script_bytes.begin(), prov_script_bytes.end()};
        provider.scripts.emplace(CScriptID(prov_script), prov_script);
    }
    for (const auto& [pubkey_hex, origin_str] : origin_pubkeys) {
        CPubKey origin_pubkey{ParseHex(pubkey_hex)};
        provider.pubkeys.emplace(origin_pubkey.GetID(), origin_pubkey);

        if (!origin_str.empty()) {
            KeyOriginInfo info;
            Span<const char> origin_sp{origin_str};
            std::vector<Span<const char>> origin_split = Split(origin_sp, "/");
            std::string fpr_str(origin_split[0].begin(), origin_split[0].end());
            auto fpr_bytes = ParseHex(fpr_str);
            std::copy(fpr_bytes.begin(), fpr_bytes.end(), info.fingerprint);
            for (size_t i = 1; i < origin_split.size(); ++i) {
                Span<const char> elem = origin_split[i];
                bool hardened = false;
                if (elem.size() > 0) {
                    const char last = elem[elem.size() - 1];
                    if (last == '\'' || last == 'h') {
                        elem = elem.first(elem.size() - 1);
                        hardened = true;
                    }
                }
                uint32_t p;
                assert(ParseUInt32(std::string(elem.begin(), elem.end()), &p));
                info.path.push_back(p | (((uint32_t)hardened) << 31));
            }

            provider.origins.emplace(origin_pubkey.GetID(), std::make_pair(origin_pubkey, info));
        }
    }

    std::string checksum{GetDescriptorChecksum(expected_desc)};

    std::unique_ptr<Descriptor> desc = InferDescriptor(script, provider);
    BOOST_CHECK_EQUAL(desc->ToString(), expected_desc + "#" + checksum);
}